

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

bool __thiscall
Hpipe::Instruction::find_rec(Instruction *this,function<bool_(Hpipe::Instruction_*)> *f)

{
  pointer pTVar1;
  pointer pTVar2;
  Instruction *this_00;
  bool bVar3;
  pointer pTVar4;
  Instruction *local_58;
  _Any_data local_50;
  code *local_40;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    local_58 = this;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_58);
    if (bVar3) {
      return true;
    }
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar1 != pTVar2) {
      do {
        pTVar4 = pTVar1 + 1;
        this_00 = pTVar1->inst;
        std::function<bool_(Hpipe::Instruction_*)>::function
                  ((function<bool_(Hpipe::Instruction_*)> *)&local_50,f);
        bVar3 = find_rec(this_00,(function<bool_(Hpipe::Instruction_*)> *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        pTVar1 = pTVar4;
      } while (pTVar4 != pTVar2 && !bVar3);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Instruction::find_rec( std::function<bool (Instruction *)> f ) {
    if ( op_id == Instruction::cur_op_id )
        return false;
    op_id = Instruction::cur_op_id;

    if ( f( this ) )
        return true;

    for( Transition &t : next )
        if ( t.inst->find_rec( f ) )
            return true;
    return false;
}